

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

char ** PHYSFS_enumerateFiles(char *path)

{
  int iVar1;
  PHYSFS_ErrorCode PVar2;
  ulong uVar3;
  char **local_20;
  undefined8 local_18;
  
  local_18 = 0;
  local_20 = (char **)(*__PHYSFS_AllocatorHooks.Malloc)(8);
  if (local_20 == (char **)0x0) {
    PVar2 = PHYSFS_ERR_OUT_OF_MEMORY;
  }
  else {
    iVar1 = PHYSFS_enumerate(path,enumFilesCallback,&local_20);
    if (iVar1 != 0) {
      local_20[local_18 & 0xffffffff] = (char *)0x0;
      return local_20;
    }
    PVar2 = currentErrorCode();
    for (uVar3 = 0; uVar3 < (local_18 & 0xffffffff); uVar3 = uVar3 + 1) {
      (*__PHYSFS_AllocatorHooks.Free)(local_20[uVar3]);
    }
    (*__PHYSFS_AllocatorHooks.Free)(local_20);
    if (PVar2 != PHYSFS_ERR_APP_CALLBACK) {
      return (char **)0x0;
    }
    PVar2 = local_18._4_4_;
    if (local_18._4_4_ == PHYSFS_ERR_OK) {
      return (char **)0x0;
    }
  }
  PHYSFS_setErrorCode(PVar2);
  return (char **)0x0;
}

Assistant:

char **PHYSFS_enumerateFiles(const char *path)
{
    EnumStringListCallbackData ecd;
    memset(&ecd, '\0', sizeof (ecd));
    ecd.list = (char **) allocator.Malloc(sizeof (char *));
    BAIL_IF(!ecd.list, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    if (!PHYSFS_enumerate(path, enumFilesCallback, &ecd))
    {
        const PHYSFS_ErrorCode errcode = currentErrorCode();
        PHYSFS_uint32 i;
        for (i = 0; i < ecd.size; i++)
            allocator.Free(ecd.list[i]);
        allocator.Free(ecd.list);
        BAIL_IF(errcode == PHYSFS_ERR_APP_CALLBACK, ecd.errcode, NULL);
        return NULL;
    } /* if */

    ecd.list[ecd.size] = NULL;
    return ecd.list;
}